

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v10::detail::dragonbox::check_divisibility_and_divide_by_pow10<2>(uint32_t *n)

{
  uint uVar1;
  bool result;
  uint32_t comparison_mask;
  uint32_t magic_number;
  anon_struct_8_2_3bf91f52 info;
  uint32_t *n_local;
  
  if (*n < 0x3e9) {
    *n = *n * 0x290;
    uVar1 = *n;
    *n = *n >> 0x10;
    return (uVar1 & 0xffff) < 0x290;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format-inl.h"
              ,0xdd,"n is too large");
}

Assistant:

auto check_divisibility_and_divide_by_pow10(uint32_t& n) noexcept -> bool {
  // The numbers below are chosen such that:
  //   1. floor(n/d) = floor(nm / 2^k) where d=10 or d=100,
  //   2. nm mod 2^k < m if and only if n is divisible by d,
  // where m is magic_number, k is shift_amount
  // and d is divisor.
  //
  // Item 1 is a common technique of replacing division by a constant with
  // multiplication, see e.g. "Division by Invariant Integers Using
  // Multiplication" by Granlund and Montgomery (1994). magic_number (m) is set
  // to ceil(2^k/d) for large enough k.
  // The idea for item 2 originates from Schubfach.
  constexpr auto info = div_small_pow10_infos[N - 1];
  FMT_ASSERT(n <= info.divisor * 10, "n is too large");
  constexpr uint32_t magic_number =
      (1u << info.shift_amount) / info.divisor + 1;
  n *= magic_number;
  const uint32_t comparison_mask = (1u << info.shift_amount) - 1;
  bool result = (n & comparison_mask) < magic_number;
  n >>= info.shift_amount;
  return result;
}